

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

bool __thiscall
capnp::_::StructReader::isCanonical
          (StructReader *this,word **readHead,word **ptrHead,bool *dataTrunc,bool *ptrTrunc)

{
  ushort uVar1;
  uint uVar2;
  PointerType PVar3;
  unsigned_short ptrIndex;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  PointerReader local_58;
  
  if ((word *)this->data != *readHead) {
    return false;
  }
  uVar2 = this->dataSize;
  if ((uVar2 & 0x3f) == 0) {
    if (uVar2 == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = ((word *)this->data)[(uVar2 >> 6) - 1].content != 0;
    }
    *dataTrunc = bVar6;
    if (this->pointerCount == 0) {
      *ptrTrunc = true;
    }
    else {
      local_58.segment = this->segment;
      local_58.capTable = this->capTable;
      local_58.pointer = this->pointers + (this->pointerCount - 1);
      local_58.nestingLimit = this->nestingLimit;
      PVar3 = PointerReader::getPointerType(&local_58);
      *ptrTrunc = PVar3 != NULL_;
    }
    uVar1 = this->pointerCount;
    *readHead = (word *)((long)&(*readHead)->content + (ulong)(((uVar2 >> 6) + (uint)uVar1) * 8));
    if (uVar1 == 0) {
      bVar6 = true;
    }
    else {
      lVar5 = 0;
      uVar4 = 0;
      do {
        if (uVar4 < this->pointerCount) {
          local_58.segment = this->segment;
          local_58.capTable = this->capTable;
          local_58.pointer = (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar5);
          local_58.nestingLimit = this->nestingLimit;
        }
        else {
          local_58.segment = (SegmentReader *)0x0;
          local_58.capTable = (CapTableReader *)0x0;
          local_58.pointer = (WirePointer *)0x0;
          local_58.nestingLimit = 0x7fffffff;
        }
        bVar6 = PointerReader::isCanonical(&local_58,ptrHead);
        if (!bVar6) {
          return bVar6;
        }
        lVar5 = lVar5 + 8;
        bVar7 = (ulong)uVar1 - 1 != uVar4;
        uVar4 = uVar4 + 1;
      } while (bVar7);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

const void* getLocation() const { return data; }